

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::AddCacheEntry(cmake *this,string *key,cmValue value,cmValue helpString,int type)

{
  char *__s1;
  size_type sVar1;
  cmMessenger *pcVar2;
  bool bVar3;
  int iVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  
  if (helpString.Value == (string *)0x0) {
    helpString.Value = &cmValue::Empty_abi_cxx11_;
  }
  cmState::AddCacheEntry
            ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,key,value,helpString.Value,type);
  UnwatchUnusedCli(this,key);
  __s1 = (key->_M_dataplus)._M_p;
  sVar1 = key->_M_string_length;
  if ((long)sVar1 < 0x1f) {
    if (sVar1 == 0x15) {
      auVar9[0] = -(__s1[5] == '_');
      auVar9[1] = -(__s1[6] == 'W');
      auVar9[2] = -(__s1[7] == 'A');
      auVar9[3] = -(__s1[8] == 'R');
      auVar9[4] = -(__s1[9] == 'N');
      auVar9[5] = -(__s1[10] == '_');
      auVar9[6] = -(__s1[0xb] == 'D');
      auVar9[7] = -(__s1[0xc] == 'E');
      auVar9[8] = -(__s1[0xd] == 'P');
      auVar9[9] = -(__s1[0xe] == 'R');
      auVar9[10] = -(__s1[0xf] == 'E');
      auVar9[0xb] = -(__s1[0x10] == 'C');
      auVar9[0xc] = -(__s1[0x11] == 'A');
      auVar9[0xd] = -(__s1[0x12] == 'T');
      auVar9[0xe] = -(__s1[0x13] == 'E');
      auVar9[0xf] = -(__s1[0x14] == 'D');
      auVar6[0] = -(*__s1 == 'C');
      auVar6[1] = -(__s1[1] == 'M');
      auVar6[2] = -(__s1[2] == 'A');
      auVar6[3] = -(__s1[3] == 'K');
      auVar6[4] = -(__s1[4] == 'E');
      auVar6[5] = -(__s1[5] == '_');
      auVar6[6] = -(__s1[6] == 'W');
      auVar6[7] = -(__s1[7] == 'A');
      auVar6[8] = -(__s1[8] == 'R');
      auVar6[9] = -(__s1[9] == 'N');
      auVar6[10] = -(__s1[10] == '_');
      auVar6[0xb] = -(__s1[0xb] == 'D');
      auVar6[0xc] = -(__s1[0xc] == 'E');
      auVar6[0xd] = -(__s1[0xd] == 'P');
      auVar6[0xe] = -(__s1[0xe] == 'R');
      auVar6[0xf] = -(__s1[0xf] == 'E');
      auVar6 = auVar6 & auVar9;
      if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
        pcVar2 = (this->Messenger)._M_t.
                 super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                 super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                 super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
        if (value.Value == (string *)0x0) {
          bVar3 = false;
        }
        else {
          value_02._M_str = ((value.Value)->_M_dataplus)._M_p;
          value_02._M_len = (value.Value)->_M_string_length;
          bVar3 = cmValue::IsOff(value_02);
        }
        pcVar2->SuppressDeprecatedWarnings = bVar3;
      }
    }
    else if ((sVar1 == 0x16) &&
            (auVar8[0] = -(__s1[6] == 'E'), auVar8[1] = -(__s1[7] == 'R'),
            auVar8[2] = -(__s1[8] == 'R'), auVar8[3] = -(__s1[9] == 'O'),
            auVar8[4] = -(__s1[10] == 'R'), auVar8[5] = -(__s1[0xb] == '_'),
            auVar8[6] = -(__s1[0xc] == 'D'), auVar8[7] = -(__s1[0xd] == 'E'),
            auVar8[8] = -(__s1[0xe] == 'P'), auVar8[9] = -(__s1[0xf] == 'R'),
            auVar8[10] = -(__s1[0x10] == 'E'), auVar8[0xb] = -(__s1[0x11] == 'C'),
            auVar8[0xc] = -(__s1[0x12] == 'A'), auVar8[0xd] = -(__s1[0x13] == 'T'),
            auVar8[0xe] = -(__s1[0x14] == 'E'), auVar8[0xf] = -(__s1[0x15] == 'D'),
            auVar5[0] = -(*__s1 == 'C'), auVar5[1] = -(__s1[1] == 'M'),
            auVar5[2] = -(__s1[2] == 'A'), auVar5[3] = -(__s1[3] == 'K'),
            auVar5[4] = -(__s1[4] == 'E'), auVar5[5] = -(__s1[5] == '_'),
            auVar5[6] = -(__s1[6] == 'E'), auVar5[7] = -(__s1[7] == 'R'),
            auVar5[8] = -(__s1[8] == 'R'), auVar5[9] = -(__s1[9] == 'O'),
            auVar5[10] = -(__s1[10] == 'R'), auVar5[0xb] = -(__s1[0xb] == '_'),
            auVar5[0xc] = -(__s1[0xc] == 'D'), auVar5[0xd] = -(__s1[0xd] == 'E'),
            auVar5[0xe] = -(__s1[0xe] == 'P'), auVar5[0xf] = -(__s1[0xf] == 'R'),
            auVar5 = auVar5 & auVar8,
            (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff)) {
      pcVar2 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      if (value.Value == (string *)0x0) {
        bVar3 = false;
      }
      else {
        value_00._M_str = extraout_RDX;
        value_00._M_len = (size_t)((value.Value)->_M_dataplus)._M_p;
        bVar3 = cmValue::IsOn((cmValue *)(value.Value)->_M_string_length,value_00);
      }
      pcVar2->DeprecatedWarningsAsErrors = bVar3;
    }
  }
  else if (sVar1 == 0x1f) {
    auVar10[0] = -(__s1[0xf] == 'D');
    auVar10[1] = -(__s1[0x10] == 'E');
    auVar10[2] = -(__s1[0x11] == 'V');
    auVar10[3] = -(__s1[0x12] == 'E');
    auVar10[4] = -(__s1[0x13] == 'L');
    auVar10[5] = -(__s1[0x14] == 'O');
    auVar10[6] = -(__s1[0x15] == 'P');
    auVar10[7] = -(__s1[0x16] == 'E');
    auVar10[8] = -(__s1[0x17] == 'R');
    auVar10[9] = -(__s1[0x18] == '_');
    auVar10[10] = -(__s1[0x19] == 'E');
    auVar10[0xb] = -(__s1[0x1a] == 'R');
    auVar10[0xc] = -(__s1[0x1b] == 'R');
    auVar10[0xd] = -(__s1[0x1c] == 'O');
    auVar10[0xe] = -(__s1[0x1d] == 'R');
    auVar10[0xf] = -(__s1[0x1e] == 'S');
    auVar7[0] = -(*__s1 == 'C');
    auVar7[1] = -(__s1[1] == 'M');
    auVar7[2] = -(__s1[2] == 'A');
    auVar7[3] = -(__s1[3] == 'K');
    auVar7[4] = -(__s1[4] == 'E');
    auVar7[5] = -(__s1[5] == '_');
    auVar7[6] = -(__s1[6] == 'S');
    auVar7[7] = -(__s1[7] == 'U');
    auVar7[8] = -(__s1[8] == 'P');
    auVar7[9] = -(__s1[9] == 'P');
    auVar7[10] = -(__s1[10] == 'R');
    auVar7[0xb] = -(__s1[0xb] == 'E');
    auVar7[0xc] = -(__s1[0xc] == 'S');
    auVar7[0xd] = -(__s1[0xd] == 'S');
    auVar7[0xe] = -(__s1[0xe] == '_');
    auVar7[0xf] = -(__s1[0xf] == 'D');
    auVar7 = auVar7 & auVar10;
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
      pcVar2 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      if (value.Value == (string *)0x0) {
        bVar3 = false;
      }
      else {
        value_03._M_str = ((value.Value)->_M_dataplus)._M_p;
        value_03._M_len = (value.Value)->_M_string_length;
        bVar3 = cmValue::IsOff(value_03);
      }
      pcVar2->DevWarningsAsErrors = bVar3;
    }
  }
  else if (sVar1 == 0x21) {
    iVar4 = bcmp(__s1,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",0x21);
    if (iVar4 == 0) {
      pcVar2 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      if (value.Value == (string *)0x0) {
        bVar3 = false;
      }
      else {
        value_01._M_str = extraout_RDX_00;
        value_01._M_len = (size_t)((value.Value)->_M_dataplus)._M_p;
        bVar3 = cmValue::IsOn((cmValue *)(value.Value)->_M_string_length,value_01);
      }
      pcVar2->SuppressDevWarnings = bVar3;
    }
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, cmValue value,
                          cmValue helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             static_cast<cmStateEnums::CacheEntryType>(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED"_s) {
    this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());
  } else if (key == "CMAKE_ERROR_DEPRECATED"_s) {
    this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS"_s) {
    this->Messenger->SetSuppressDevWarnings(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS"_s) {
    this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());
  }
}